

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_manyvec.c
# Opt level: O1

int main(void)

{
  uint uVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  FILE *pFVar8;
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  void *arkode_mem;
  SUNContext ctx;
  sunrealtype t;
  long netf;
  long ncfn;
  long nni;
  long nfeLS;
  long nJv;
  long nlcf;
  long nli;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  N_Vector uvw [3];
  long local_128;
  double local_120;
  undefined8 local_118;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  double local_e0;
  double local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 *local_c0;
  long local_b8;
  ulong local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_128 = 0;
  uVar1 = SUNContext_Create(0,&local_118);
  if ((int)uVar1 < 0) {
    pcVar9 = "SUNContext_Create";
  }
  else {
    puVar2 = (undefined8 *)malloc(0x40);
    if (puVar2 == (undefined8 *)0x0) {
      main_cold_10();
      return 1;
    }
    *puVar2 = 0xc9;
    puVar2[2] = 0x3fe3333333333333;
    puVar2[3] = 0x4000000000000000;
    puVar2[4] = 0x3f50624dd2f1a9fc;
    puVar2[5] = 0x3f50624dd2f1a9fc;
    puVar2[6] = 0x3f50624dd2f1a9fc;
    puVar2[7] = 0x3ee4f8b588e368f1;
    puts("\n1D Brusselator PDE test problem:");
    printf("    N = %li\n",*puVar2);
    printf("    problem parameters:  a = %g,  b = %g,  ep = %g\n",(int)puVar2[2],puVar2[3],puVar2[7]
          );
    printf("    diffusion coefficients:  du = %g,  dv = %g,  dw = %g\n",(int)puVar2[4],puVar2[5],
           puVar2[6]);
    printf("    reltol = %.1e,  abstol = %.1e\n\n",0xa0b5ed8d,0x3ddb7cdfd9d7bdbb);
    puVar2[1] = 0x3f747ae147ae147b;
    lVar3 = N_VNew_Serial(0xc9,local_118);
    if (lVar3 == 0) {
      main_cold_9();
      return 1;
    }
    local_108 = N_VClone(lVar3);
    if (local_108 == 0) {
      main_cold_8();
      return 1;
    }
    lVar4 = N_VClone(lVar3);
    if (lVar4 == 0) {
      main_cold_7();
      return 1;
    }
    local_40 = local_108;
    local_48 = lVar3;
    local_38 = lVar4;
    local_110 = N_VNew_ManyVector(3,&local_48,local_118);
    if (local_110 == 0) {
      main_cold_6();
      return 1;
    }
    lVar5 = N_VGetArrayPointer(lVar3);
    if (lVar5 == 0) {
      main_cold_5();
      return 1;
    }
    lVar6 = N_VGetArrayPointer(local_108);
    if (lVar6 == 0) {
      main_cold_4();
      return 1;
    }
    lVar7 = N_VGetArrayPointer(lVar4);
    local_100 = lVar7;
    if (lVar7 == 0) {
      main_cold_3();
      return 1;
    }
    lVar10 = 0;
    local_e8 = lVar4;
    do {
      local_120 = (double)lVar10 * 3.141592653589793;
      dVar14 = sin((double)puVar2[1] * local_120);
      *(double *)(lVar5 + lVar10 * 8) = dVar14 * 0.1 + 0.6;
      dVar14 = sin((double)puVar2[1] * local_120);
      *(double *)(lVar6 + lVar10 * 8) = dVar14 * 0.1 + 3.3333333333333335;
      dVar14 = sin(local_120 * (double)puVar2[1]);
      *(double *)(lVar7 + lVar10 * 8) = dVar14 * 0.1 + 2.0;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0xc9);
    local_128 = ARKStepCreate(0,fe,fi,local_110,local_118);
    if (local_128 == 0) {
      main_cold_2();
      return 1;
    }
    uVar1 = ARKodeSetUserData(local_128,puVar2);
    if ((int)uVar1 < 0) {
      pcVar9 = "ARKodeSetUserData";
    }
    else {
      uVar1 = ARKodeSStolerances(0xa0b5ed8d,0x3ddb7cdfd9d7bdbb,local_128);
      if ((int)uVar1 < 0) {
        pcVar9 = "ARKodeSStolerances";
      }
      else {
        lVar4 = SUNLinSol_SPGMR(local_110,0,10,local_118);
        if (lVar4 == 0) {
          main_cold_1();
          return 1;
        }
        uVar1 = ARKodeSetLinearSolver(local_128,lVar4,0);
        if ((int)uVar1 < 0) {
          pcVar9 = "ARKodeSetLinearSolver";
        }
        else {
          uVar1 = ARKodeSetJacTimes(local_128,0,JacVI);
          if (-1 < (int)uVar1) {
            local_f8 = lVar5;
            local_f0 = lVar3;
            local_c8 = lVar4;
            pFVar8 = fopen("bruss_mesh.txt","w");
            lVar3 = 0;
            do {
              fprintf(pFVar8,"  %.16e\n",SUB84((double)lVar3 * (double)puVar2[1],0));
              lVar3 = lVar3 + 1;
            } while (lVar3 != 0xc9);
            local_c0 = puVar2;
            fclose(pFVar8);
            pFVar8 = fopen("bruss_u.txt","w");
            __stream = fopen("bruss_v.txt","w");
            __stream_00 = fopen("bruss_w.txt","w");
            lVar3 = local_f8;
            lVar4 = 0;
            do {
              fprintf(pFVar8," %.16e",(int)*(undefined8 *)(lVar3 + lVar4 * 8));
              lVar4 = lVar4 + 1;
            } while (lVar4 != 0xc9);
            lVar3 = 0;
            do {
              fprintf(__stream," %.16e",(int)*(undefined8 *)(lVar6 + lVar3 * 8));
              lVar4 = local_100;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 0xc9);
            lVar3 = 0;
            do {
              fprintf(__stream_00," %.16e",(int)*(undefined8 *)(lVar4 + lVar3 * 8));
              lVar3 = lVar3 + 1;
            } while (lVar3 != 0xc9);
            fputc(10,pFVar8);
            fputc(10,__stream);
            fputc(10,__stream_00);
            local_d0 = 0;
            puts("        t      ||u||_rms   ||v||_rms   ||w||_rms");
            puts("   ----------------------------------------------");
            uVar11 = 0;
            uVar12 = 0x9999999a;
            uVar13 = 0x3fb99999;
            local_b8 = lVar6;
            do {
              local_120 = (double)CONCAT44(uVar13,uVar12);
              uVar1 = ARKodeEvolve(local_128,local_110,&local_d0,1);
              if ((int)uVar1 < 0) {
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeEvolve",
                        (ulong)uVar1);
                break;
              }
              dVar14 = (double)N_VDotProd(local_f0,local_f0);
              dVar14 = dVar14 / 201.0;
              if (dVar14 < 0.0) {
                local_d8 = sqrt(dVar14);
              }
              else {
                local_d8 = SQRT(dVar14);
              }
              dVar14 = (double)N_VDotProd(local_108,local_108);
              dVar14 = dVar14 / 201.0;
              if (dVar14 < 0.0) {
                local_e0 = sqrt(dVar14);
              }
              else {
                local_e0 = SQRT(dVar14);
              }
              dVar14 = (double)N_VDotProd(local_e8,local_e8);
              dVar14 = dVar14 / 201.0;
              local_b0 = uVar11;
              if (dVar14 < 0.0) {
                dVar14 = sqrt(dVar14);
              }
              else {
                dVar14 = SQRT(dVar14);
              }
              printf("  %10.6f  %10.6f  %10.6f  %10.6f\n",(int)local_d0,local_d8,local_e0,dVar14);
              lVar3 = local_f8;
              local_120 = local_120 + 0.1;
              lVar4 = 0;
              do {
                fprintf(pFVar8," %.16e",(int)*(undefined8 *)(lVar3 + lVar4 * 8));
                lVar5 = local_b8;
                lVar4 = lVar4 + 1;
              } while (lVar4 != 0xc9);
              lVar3 = 0;
              do {
                fprintf(__stream," %.16e",(int)*(undefined8 *)(lVar5 + lVar3 * 8));
                lVar4 = local_100;
                lVar3 = lVar3 + 1;
              } while (lVar3 != 0xc9);
              lVar3 = 0;
              do {
                fprintf(__stream_00," %.16e",(int)*(undefined8 *)(lVar4 + lVar3 * 8));
                lVar3 = lVar3 + 1;
              } while (lVar3 != 0xc9);
              uVar12 = 0;
              uVar13 = 0x40240000;
              if (local_120 <= 10.0) {
                uVar12 = SUB84(local_120,0);
                uVar13 = (undefined4)((ulong)local_120 >> 0x20);
              }
              local_120 = (double)CONCAT44(uVar13,uVar12);
              fputc(10,pFVar8);
              fputc(10,__stream);
              fputc(10,__stream_00);
              uVar1 = (int)local_b0 + 1;
              uVar11 = (ulong)uVar1;
              uVar12 = SUB84(local_120,0);
              uVar13 = (undefined4)((ulong)local_120 >> 0x20);
            } while (uVar1 != 100);
            puts("   ----------------------------------------------");
            fclose(pFVar8);
            fclose(__stream);
            fclose(__stream_00);
            uVar1 = ARKodeGetNumSteps(local_128,&local_50);
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n","ARKodeGetNumSteps"
                      ,(ulong)uVar1);
            }
            uVar1 = ARKodeGetNumStepAttempts(local_128,&local_58);
            puVar2 = local_c0;
            lVar3 = local_e8;
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumStepAttempts",(ulong)uVar1);
            }
            uVar1 = ARKStepGetNumRhsEvals(local_128,&local_60,&local_68);
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKStepGetNumRhsEvals",(ulong)uVar1);
            }
            uVar1 = ARKodeGetNumLinSolvSetups(local_128,&local_70);
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumLinSolvSetups",(ulong)uVar1);
            }
            uVar1 = ARKodeGetNumErrTestFails(local_128,&local_a8);
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumErrTestFails",(ulong)uVar1);
            }
            uVar1 = ARKodeGetNumNonlinSolvIters(local_128,&local_98);
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumNonlinSolvIters",(ulong)uVar1);
            }
            uVar1 = ARKodeGetNumNonlinSolvConvFails(local_128,&local_a0);
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumNonlinSolvConvFails",(ulong)uVar1);
            }
            uVar1 = ARKodeGetNumLinIters(local_128,&local_78);
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumLinIters",(ulong)uVar1);
            }
            uVar1 = ARKodeGetNumLinConvFails(local_128,&local_80);
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumLinConvFails",(ulong)uVar1);
            }
            uVar1 = ARKodeGetNumJtimesEvals(local_128,&local_88);
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumJtimesEvals",(ulong)uVar1);
            }
            uVar1 = ARKodeGetNumLinRhsEvals(local_128,&local_90);
            if ((int)uVar1 < 0) {
              fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                      "ARKodeGetNumLinRhsEvals",(ulong)uVar1);
            }
            puts("\nFinal Solver Statistics:");
            printf("   Internal solver steps = %li (attempted = %li)\n",local_50,local_58);
            printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_60,local_68);
            printf("   Total linear solver setups = %li\n",local_70);
            printf("   Total linear iterations = %li\n",local_78);
            printf("   Total linear convergence failures = %li\n",local_80);
            printf("   Total J*v evaluations = %li\n",local_88);
            printf("   Total RHS evals in linear solver = %li\n",local_90);
            printf("   Total number of Newton iterations = %li\n",local_98);
            printf("   Total number of nonlinear solver convergence failures = %li\n",local_a0);
            printf("   Total number of error test failures = %li\n\n",local_a8);
            N_VDestroy(local_110);
            N_VDestroy(local_f0);
            N_VDestroy(local_108);
            N_VDestroy(lVar3);
            free(puVar2);
            ARKodeFree(&local_128);
            SUNLinSolFree(local_c8);
            SUNContext_Free(&local_118);
            return 0;
          }
          pcVar9 = "ARKodeSetJacTimes";
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar9,(ulong)uVar1);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = ZERO;             /* initial time */
  sunrealtype Tf    = SUN_RCONST(10.0); /* final time */
  int Nt            = 100;              /* total number of output times */
  int Nvar          = 3;                /* number of solution fields */
  UserData userdata = NULL;
  sunrealtype *udata, *vdata, *wdata;
  sunindextype N     = 201;             /* spatial mesh size */
  sunrealtype a      = SUN_RCONST(0.6); /* problem parameters */
  sunrealtype b      = SUN_RCONST(2.0);
  sunrealtype du     = SUN_RCONST(0.001);
  sunrealtype dv     = SUN_RCONST(0.001);
  sunrealtype dw     = SUN_RCONST(0.001);
  sunrealtype ep     = SUN_RCONST(1.0e-5); /* stiffness parameter */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunindextype i;

  /* general problem variables */
  int flag;          /* reusable error-checking flag */
  N_Vector y = NULL; /* empty manyvector for storing solution */
  N_Vector u = NULL; /* empty vectors for storing solution components */
  N_Vector v = NULL;
  N_Vector w = NULL;
  N_Vector uvw[3]; /* vector array composed of u,v,w component vectors */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  sunrealtype pi, t, dTout, tout, unorm, vnorm, wnorm;
  FILE *FID, *UFID, *VFID, *WFID;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nli, nlcf, nJv, nfeLS, nni, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* allocate udata structure */
  userdata = (UserData)malloc(sizeof(*userdata));
  if (check_flag((void*)userdata, "malloc", 2)) { return 1; }

  /* store the inputs in the UserData structure */
  userdata->N  = N;
  userdata->a  = a;
  userdata->b  = b;
  userdata->du = du;
  userdata->dv = dv;
  userdata->dw = dw;
  userdata->ep = ep;

  /* Initial problem output */
  printf("\n1D Brusselator PDE test problem:\n");
  printf("    N = %li\n", (long int)userdata->N);
  printf("    problem parameters:  a = %" GSYM ",  b = %" GSYM ",  ep = %" GSYM
         "\n",
         userdata->a, userdata->b, userdata->ep);
  printf("    diffusion coefficients:  du = %" GSYM ",  dv = %" GSYM
         ",  dw = %" GSYM "\n",
         userdata->du, userdata->dv, userdata->dw);
  printf("    reltol = %.1" ESYM ",  abstol = %.1" ESYM "\n\n", reltol, abstol);

  /* Initialize data structures */
  userdata->dx = ONE / (N - 1);         /* set spatial mesh spacing */
  u            = N_VNew_Serial(N, ctx); /* Create serial vectors */
  if (check_flag((void*)u, "N_VNew_Serial", 0)) { return 1; }
  v = N_VClone(u);
  if (check_flag((void*)v, "N_VClone", 0)) { return 1; }
  w = N_VClone(u);
  if (check_flag((void*)w, "N_VClone", 0)) { return 1; }

  /* Create manyvector for solution */
  uvw[0] = u;
  uvw[1] = v;
  uvw[2] = w;
  y      = N_VNew_ManyVector(Nvar, uvw, ctx);
  if (check_flag((void*)y, "N_VNew_ManyVector", 0)) { return 1; }

  udata = N_VGetArrayPointer(u); /* Access data array for new NVector u */
  if (check_flag((void*)udata, "N_VGetArrayPointer", 0)) { return 1; }
  vdata = N_VGetArrayPointer(v); /* Access data array for new NVector v */
  if (check_flag((void*)vdata, "N_VGetArrayPointer", 0)) { return 1; }
  wdata = N_VGetArrayPointer(w); /* Access data array for new NVector w */
  if (check_flag((void*)wdata, "N_VGetArrayPointer", 0)) { return 1; }

  /* Set initial conditions into y */
  pi = SUN_RCONST(4.0) * atan(ONE);
  for (i = 0; i < N; i++)
  {
    udata[i] = a + SUN_RCONST(0.1) * sin(pi * i * userdata->dx);     /* u */
    vdata[i] = b / a + SUN_RCONST(0.1) * sin(pi * i * userdata->dx); /* v */
    wdata[i] = b + SUN_RCONST(0.1) * sin(pi * i * userdata->dx);     /* w */
  }

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(fe, fi, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetUserData(arkode_mem,
                           (void*)userdata); /* Pass udata to user functions */
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }
  flag = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Initialize spgmr solver */
  LS = SUNLinSol_SPGMR(y, SUN_PREC_NONE, 10, ctx);
  if (check_flag((void*)LS, "SUNLinSol_SPGMR", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS, NULL); /* Attach linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacTimes(arkode_mem, NULL,
                           JacVI); /* Set the Jacobian-vector product */
  if (check_flag(&flag, "ARKodeSetJacTimes", 1)) { return 1; }

  /* output spatial mesh to disk */
  FID = fopen("bruss_mesh.txt", "w");
  for (i = 0; i < N; i++)
  {
    fprintf(FID, "  %.16" ESYM "\n", userdata->dx * i);
  }
  fclose(FID);

  /* Open output streams for results, access data array */
  UFID = fopen("bruss_u.txt", "w");
  VFID = fopen("bruss_v.txt", "w");
  WFID = fopen("bruss_w.txt", "w");

  /* output initial condition to disk */
  for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", udata[i]); }
  for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM "", vdata[i]); }
  for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM "", wdata[i]); }
  fprintf(UFID, "\n");
  fprintf(VFID, "\n");
  fprintf(WFID, "\n");

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t     = T0;
  dTout = (Tf - T0) / Nt;
  tout  = T0 + dTout;
  printf("        t      ||u||_rms   ||v||_rms   ||w||_rms\n");
  printf("   ----------------------------------------------\n");
  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }

    /* print solution statistics */
    unorm = N_VDotProd(u, u);
    unorm = sqrt(unorm / N);
    vnorm = N_VDotProd(v, v);
    vnorm = sqrt(vnorm / N);
    wnorm = N_VDotProd(w, w);
    wnorm = sqrt(wnorm / N);
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "\n", t,
           unorm, vnorm, wnorm);

    /* check integrator flag */
    if (flag >= 0)
    { /* successful solve: update output time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }

    /* output results to disk */
    for (i = 0; i < N; i++) { fprintf(UFID, " %.16" ESYM "", udata[i]); }
    for (i = 0; i < N; i++) { fprintf(VFID, " %.16" ESYM "", vdata[i]); }
    for (i = 0; i < N; i++) { fprintf(WFID, " %.16" ESYM "", wdata[i]); }
    fprintf(UFID, "\n");
    fprintf(VFID, "\n");
    fprintf(WFID, "\n");
  }
  printf("   ----------------------------------------------\n");
  fclose(UFID);
  fclose(VFID);
  fclose(WFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_flag(&flag, "ARKStepGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumLinIters(arkode_mem, &nli);
  check_flag(&flag, "ARKodeGetNumLinIters", 1);
  flag = ARKodeGetNumLinConvFails(arkode_mem, &nlcf);
  check_flag(&flag, "ARKodeGetNumLinConvFails", 1);
  flag = ARKodeGetNumJtimesEvals(arkode_mem, &nJv);
  check_flag(&flag, "ARKodeGetNumJtimesEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total linear iterations = %li\n", nli);
  printf("   Total linear convergence failures = %li\n", nlcf);
  printf("   Total J*v evaluations = %li\n", nJv);
  printf("   Total RHS evals in linear solver = %li\n", nfeLS);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of nonlinear solver convergence failures = %li\n",
         ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* Clean up and return with successful completion */
  N_VDestroy(y); /* Free vectors */
  N_VDestroy(u);
  N_VDestroy(v);
  N_VDestroy(w);
  free(userdata);          /* Free user data */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}